

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O3

int arti_invoke(obj *obj)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  char cVar4;
  schar sVar5;
  boolean bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  obj *poVar13;
  nh_menuitem *items;
  int *piVar14;
  int tmp;
  int iVar15;
  int iVar16;
  ulong uVar17;
  obj *poVar18;
  artifact *paVar19;
  dungeon *__src;
  int iVar20;
  int n;
  uint uVar21;
  ulong uVar22;
  byte bVar23;
  boolean unused_known;
  obj pseudo;
  d_level local_aa;
  ulong local_a8;
  d_level *local_a0;
  obj local_98;
  
  uVar7 = moves;
  bVar23 = 0;
  if ((obj == (obj *)0x0) || (lVar10 = (long)obj->oartifact, lVar10 == 0)) {
LAB_0014b4d0:
    cVar4 = obj->oclass;
    if ((cVar4 == '\x06') || (cVar4 == '\r')) {
      iVar15 = dorub(obj);
      return iVar15;
    }
    if (cVar4 == '\v') {
      iVar15 = do_break_wand(obj);
      return iVar15;
    }
    if (1 < (ushort)obj->otyp - 0xd8) {
      if (obj->otyp == 0xec) {
        use_crystal_ball(obj);
      }
      else {
        pline("Nothing happens.");
      }
      return 1;
    }
    iVar15 = invoke_amulet(obj);
    return iVar15;
  }
  uVar22 = (ulong)artilist[lVar10].inv_prop;
  if (uVar22 == 0) goto LAB_0014b4d0;
  paVar19 = artilist + lVar10;
  if (artilist[lVar10].inv_prop < 0x43) {
    uVar7 = u.uprops[uVar22].extrinsic;
    uVar8 = u.uprops[uVar22].intrinsic;
    uVar21 = uVar7 ^ 0x2000;
    u.uprops[uVar22].extrinsic = uVar21;
    if ((uVar21 >> 0xd & 1) == 0) {
      local_a8 = CONCAT44(local_a8._4_4_,uVar8);
      local_a0 = (d_level *)CONCAT44(local_a0._4_4_,moves);
      uVar7 = mt_random();
      uVar8 = 1;
      do {
        uVar9 = mt_random();
        if (1 < uVar9 % 6) goto LAB_0014b5db;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 10);
      uVar8 = 10;
LAB_0014b5db:
      uVar22 = (ulong)uVar8 * (ulong)(uVar7 % 1000 + 1000);
      uVar7 = mt_random();
      if ((uVar7 & 1) == 0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar22;
        iVar15 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(100000)) / auVar2,0);
      }
      else {
        iVar15 = (int)(uVar22 / 10);
      }
      obj->age = (int)local_a0 + iVar15;
      uVar8 = (uint)local_a8;
    }
    else if (moves < (uint)obj->age) {
      u.uprops[uVar22].extrinsic = uVar7;
      pcVar11 = xname(obj);
      pcVar11 = the(pcVar11);
      pcVar12 = otense(obj,"are");
      pline("You feel that %s %s ignoring you.",pcVar11,pcVar12);
      iVar15 = 3;
      iVar20 = -3;
      do {
        uVar7 = mt_random();
        iVar15 = iVar15 + uVar7 % 10;
        iVar20 = iVar20 + 1;
      } while (iVar20 != 0);
      goto LAB_0014b713;
    }
    if (((uVar21 & 0xffffdfff) == 0) && (uVar8 == 0)) {
      uVar1 = paVar19->inv_prop;
      if (uVar1 != '\r') {
        if (uVar1 == '\x12') {
          if ((uVar21 >> 0xd & 1) != 0) {
            float_up();
            spoteffects('\0');
            return 1;
          }
          float_down(0x10ffffff,0x2000);
          return 1;
        }
        if (uVar1 != '\x15') {
          return 1;
        }
        if ((uVar21 >> 0xd & 1) == 0) {
          pcVar11 = "You feel the tension decrease around you.";
        }
        else {
          pcVar11 = "You feel like a rabble-rouser.";
        }
        goto LAB_0014bddd;
      }
      if (u.uprops[0xd].blocked == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014b86b;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014b862;
LAB_0014be86:
          newsym((int)u.ux,(int)u.uy);
          if ((uVar21 >> 0xd & 1) != 0) {
            pcVar11 = "strange";
            if ((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) {
              if (u.umonnum == u.umonster) {
                pcVar11 = "normal";
              }
              else {
                bVar6 = dmgtype(youmonst.data,0x24);
                pcVar11 = "strange";
                if (bVar6 == '\0') {
                  pcVar11 = "normal";
                }
              }
            }
            pline("Your body takes on a %s transparency...",pcVar11);
            return 1;
          }
          pcVar11 = "Your body seems to unfade...";
          goto LAB_0014bddd;
        }
LAB_0014b862:
        if (ublindf != (obj *)0x0) {
LAB_0014b86b:
          if (ublindf->oartifact == '\x1d') goto LAB_0014be86;
        }
      }
    }
    goto LAB_0014bdca;
  }
  if (moves < (uint)obj->age) {
    pcVar11 = xname(obj);
    pcVar11 = the(pcVar11);
    pcVar12 = otense(obj,"are");
    pline("You feel that %s %s ignoring you.",pcVar11,pcVar12);
    iVar15 = 3;
    iVar20 = -3;
    do {
      uVar7 = mt_random();
      iVar15 = iVar15 + uVar7 % 10;
      iVar20 = iVar20 + 1;
    } while (iVar20 != 0);
LAB_0014b713:
    obj->age = obj->age + iVar15;
    return 1;
  }
  uVar8 = mt_random();
  uVar21 = 1;
  do {
    uVar9 = mt_random();
    if (1 < uVar9 % 6) goto LAB_0014b670;
    uVar21 = uVar21 + 1;
  } while (uVar21 != 10);
  uVar21 = 10;
LAB_0014b670:
  uVar22 = (ulong)uVar21 * (ulong)(uVar8 % 1000 + 1000);
  uVar8 = mt_random();
  if ((uVar8 & 1) == 0) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar22;
    iVar15 = SUB164((ZEXT816(0) << 0x40 | ZEXT816(100000)) / auVar3,0);
  }
  else {
    iVar15 = (int)(uVar22 / 10);
  }
  obj->age = uVar7 + iVar15;
  uVar7 = u.ucreamed;
  iVar15 = 1;
  switch(paVar19->inv_prop) {
  case 'C':
    poVar13 = &zeroobj;
    poVar18 = &local_98;
    for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
      poVar18->nobj = poVar13->nobj;
      poVar13 = (obj *)((long)poVar13 + ((ulong)bVar23 * -2 + 1) * 8);
      poVar18 = (obj *)((long)poVar18 + (ulong)bVar23 * -0x10 + 8);
    }
    local_98.otyp = 0x159;
    seffects(&local_98,&local_aa.dnum);
    break;
  case 'D':
    uVar22 = (ulong)u.ucreamed;
    iVar20 = u.mhmax - u.mh;
    if (u.umonnum == u.umonster) {
      iVar20 = u.uhpmax - u.uhp;
    }
    if ((((0xfffffffc < iVar20 - 1U) && (u.uprops[0x1d].intrinsic == 0)) &&
        (u.uprops[0x3a].intrinsic == 0)) && (u.uprops[0x1e].intrinsic <= u.ucreamed))
    goto LAB_0014bdca;
    pline("You feel better.");
    if (1 < iVar20 + 1) {
      piVar14 = &u.mh;
      if (u.umonnum == u.umonster) {
        piVar14 = &u.uhp;
      }
      *piVar14 = *piVar14 + ((iVar20 - (iVar20 + 1 >> 0x1f)) + 1 >> 1);
    }
    if (u.uprops[0x1d].intrinsic != 0) {
      make_sick(0,(char *)0x0,'\0',3);
    }
    if (u.uprops[0x3a].intrinsic != 0) {
      u.uprops[0x3a].intrinsic = 0;
    }
    if (uVar7 < u.uprops[0x1e].intrinsic) {
      make_blinded(uVar22,'\0');
    }
    goto LAB_0014bc2e;
  case 'E':
    iVar20 = (u.uenmax - u.uen) + 1;
    iVar16 = 0x78;
    if (iVar20 < 0xf2) {
      iVar16 = iVar20 / 2;
      if (iVar20 < 0x18) {
        iVar16 = u.uenmax - u.uen;
      }
      if (iVar16 == 0) goto LAB_0014bdca;
    }
    pline("You feel re-energized.");
    u.uen = u.uen + iVar16;
LAB_0014bc2e:
    iflags.botl = '\x01';
    break;
  case 'F':
    iVar15 = untrap('\x01');
    if (iVar15 != 0) {
      return 1;
    }
    goto LAB_0014bb15;
  case 'G':
    poVar13 = getobj("\x13\x14","charge",(obj **)0x0);
    if (poVar13 != (obj *)0x0) {
      if (((*(uint *)&obj->field_0x4a & 2) == 0) ||
         (iVar15 = 1, paVar19->role != 0 && urole.malenum != paVar19->role)) {
        iVar15 = -(*(uint *)&obj->field_0x4a & 1);
      }
      recharge(poVar13,iVar15);
      update_inventory();
      return 1;
    }
LAB_0014bb15:
    obj->age = 0;
    iVar15 = 0;
    break;
  case 'H':
    level_tele();
    break;
  case 'I':
    bVar6 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
    if ((bVar6 == '\0') || (u.ushops[0] == '\0')) {
      local_a0 = &u.uz;
      uVar22 = (ulong)n_dgns;
      items = (nh_menuitem *)malloc(uVar22 * 0x10c);
      local_a8 = uVar22;
      if ((long)uVar22 < 1) {
        iVar15 = 0;
LAB_0014beac:
        free(items);
      }
      else {
        __src = dungeons;
        uVar17 = 0;
        iVar20 = 0;
        uVar22 = 0;
        do {
          if (__src->dunlev_ureached != '\0') {
            items[iVar20].id = (int)uVar17 + 1;
            items[iVar20].accel = '\0';
            items[iVar20].role = MI_NORMAL;
            items[iVar20].selected = '\0';
            strcpy(items[iVar20].caption,__src->dname);
            iVar20 = iVar20 + 1;
            uVar22 = uVar17 & 0xffffffff;
          }
          iVar15 = (int)uVar22;
          uVar17 = uVar17 + 1;
          __src = __src + 1;
        } while (local_a8 != uVar17);
        if (iVar20 < 2) goto LAB_0014beac;
        iVar15 = display_menu(items,iVar20,"Open a portal to which dungeon?",1,(int *)&local_98);
        free(items);
        if (iVar15 < 1) goto LAB_0014bdca;
        iVar15 = (int)local_98.nobj + -1;
      }
      cVar4 = (char)iVar15;
      iVar20 = dungeons[iVar15].depth_start;
      local_aa.dnum = cVar4;
      sVar5 = depth(local_a0);
      local_aa.dlevel = *(xchar *)((long)iVar15 * 0x38 + 0x31de1c + (ulong)(iVar20 < sVar5) * 2);
      if ((((u.uhave._0_1_ & 1) == 0) && (u.uz.dnum != dungeon_topology.d_astral_level.dnum)) &&
         (dungeon_topology.d_astral_level.dnum != cVar4 && u.uz.dnum != cVar4)) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014bf8e;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014bf89;
LAB_0014bff7:
          pcVar11 = "You are surrounded by a shimmering sphere!";
        }
        else {
LAB_0014bf89:
          if (ublindf != (obj *)0x0) {
LAB_0014bf8e:
            if (ublindf->oartifact == '\x1d') goto LAB_0014bff7;
          }
          pcVar11 = "You feel weightless for a moment.";
        }
        pline(pcVar11);
        goto_level(&local_aa,'\0','\0','\0');
        return 1;
      }
    }
    pcVar11 = "You feel very disoriented for a moment.";
    goto LAB_0014bddd;
  case 'J':
    enlightenment(0);
    break;
  case 'K':
    poVar13 = mksobj(level,1,'\x01','\0');
    if (poVar13 != (obj *)0x0) {
      uVar8 = *(uint *)&obj->field_0x4a & 2;
      uVar7 = *(uint *)&poVar13->field_0x4a;
      *(uint *)&poVar13->field_0x4a = uVar7 & 0xfffffffd | uVar8;
      uVar21 = *(uint *)&obj->field_0x4a & 1;
      *(uint *)&poVar13->field_0x4a = uVar7 & 0xfffffffc | uVar8 | uVar21;
      *(uint *)&poVar13->field_0x4a =
           uVar7 & 0xffffffbc | uVar8 | uVar21 | *(uint *)&obj->field_0x4a & 0x40;
      if ((*(uint *)&obj->field_0x4a & 2) == 0) {
        if ((*(uint *)&obj->field_0x4a & 1) != 0) {
          if ('\0' < poVar13->spe) {
            poVar13->spe = '\0';
          }
          goto LAB_0014be2c;
        }
        uVar8 = mt_random();
        uVar7 = uVar8 / 5;
      }
      else {
        if (poVar13->spe < '\0') {
          poVar13->spe = '\0';
        }
        uVar8 = mt_random();
        uVar7 = (uVar8 / 10) * 2;
      }
      poVar13->quan = uVar8 + uVar7 * -5 + poVar13->quan + 1;
LAB_0014be2c:
      uVar7 = weight(poVar13);
      poVar13->owt = uVar7;
      pcVar11 = aobjnam(poVar13,"fall");
      hold_another_object(poVar13,"Suddenly %s out.",pcVar11,(char *)0x0);
      return 1;
    }
    goto LAB_0014bdca;
  case 'L':
    if ((u.uprops[0x3e].extrinsic == 0 && u.uprops[0x3e].intrinsic == 0) &&
       (((youmonst.data)->mflags1 & 8) == 0)) {
      if (paVar19 != artilist + 0x1a) goto LAB_0014ba27;
      if (uball != obj && uball != (obj *)0x0) {
        pcVar11 = yname(uball);
        pline("You are liberated from %s!",pcVar11);
        unpunish();
      }
      if (uball != (obj *)0x0) goto LAB_0014ba27;
      poVar13 = mkobj(level,'\x10','\x01');
      setworn(poVar13,0x400000);
      setworn(obj,0x200000);
      uball->spe = '\x01';
      if ((u._1052_1_ & 1) == 0) {
        placebc();
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0014b9f0;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0014b9eb;
        }
        else {
LAB_0014b9eb:
          if (ublindf != (obj *)0x0) {
LAB_0014b9f0:
            if (ublindf->oartifact == '\x1d') goto LAB_0014ba00;
          }
          set_bc(1);
        }
LAB_0014ba00:
        newsym((int)u.ux,(int)u.uy);
      }
      pcVar11 = xname(obj);
      pline("Your %s chains itself to you!",pcVar11);
LAB_0014ba27:
      pcVar11 = "Your body begins to feel less solid.";
      if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
         ((u.umonnum == u.umonster || (bVar6 = dmgtype(youmonst.data,0x24), bVar6 == '\0')))) {
        pcVar11 = "You feel one with the spirit world.";
      }
      pline(pcVar11);
      uVar7 = mt_random();
      incr_itimeout(&u.uprops[0x3e].intrinsic,(ulong)(uVar7 % 100 + 0x33));
      obj->age = obj->age + u.uprops[0x3e].intrinsic;
      return 1;
    }
LAB_0014bdca:
    iVar15 = 1;
    if (obj->where == '\x03') {
      pcVar11 = "You feel a surge of power, but nothing seems to happen.";
LAB_0014bddd:
      iVar15 = 1;
      pline(pcVar11);
    }
  }
  return iVar15;
}

Assistant:

static int arti_invoke(struct obj *obj)
{
    const struct artifact *oart = get_artifact(obj);

    if (!oart || !oart->inv_prop) {
        if (obj->oclass == WAND_CLASS)
            return do_break_wand(obj);
        else if (obj->oclass == GEM_CLASS || obj->oclass == TOOL_CLASS)
            return dorub(obj);
	else if (obj->otyp == CRYSTAL_BALL)
	    use_crystal_ball(obj);
	else if (obj->otyp == AMULET_OF_YENDOR ||
		 obj->otyp == FAKE_AMULET_OF_YENDOR)
	    /* The Amulet is not technically an artifact
	     * in the usual sense... */
	    return invoke_amulet(obj);
	else
	    pline("Nothing happens.");
	return 1;
    }

    if (oart->inv_prop > LAST_PROP) {
	/* It's a special power, not "just" a property */
	if (obj->age > moves) {
	    /* the artifact is tired :-) */
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* and just got more so; patience is essential... */
	    obj->age += (long) dice(3,10);
	    return 1;
	}
	obj->age = moves + rnz(100);

	switch(oart->inv_prop) {
	case TAMING: {
	    struct obj pseudo;
	    boolean unused_known;

	    pseudo = zeroobj;	/* neither cursed nor blessed */
	    pseudo.otyp = SCR_TAMING;
	    seffects(&pseudo, &unused_known);
	    break;
	  }
	case HEALING: {
	    int healamt = (u.uhpmax + 1 - u.uhp) / 2;
	    long creamed = (long)u.ucreamed;

	    if (Upolyd) healamt = (u.mhmax + 1 - u.mh) / 2;
	    if (healamt || Sick || Slimed || Blinded > creamed)
		pline("You feel better.");
	    else
		goto nothing_special;
	    if (healamt > 0) {
		if (Upolyd) u.mh += healamt;
		else u.uhp += healamt;
	    }
	    if (Sick) make_sick(0L,NULL,FALSE,SICK_ALL);
	    if (Slimed) Slimed = 0L;
	    if (Blinded > creamed) make_blinded(creamed, FALSE);
	    iflags.botl = 1;
	    break;
	  }
	case ENERGY_BOOST: {
	    int epboost = (u.uenmax + 1 - u.uen) / 2;
	    if (epboost > 120) epboost = 120;		/* arbitrary */
	    else if (epboost < 12) epboost = u.uenmax - u.uen;
	    if (epboost) {
		pline("You feel re-energized.");
		u.uen += epboost;
		iflags.botl = 1;
	    } else
		goto nothing_special;
	    break;
	  }
	case UNTRAP: {
	    if (!untrap(TRUE)) {
		obj->age = 0; /* don't charge for changing their mind */
		return 0;
	    }
	    break;
	  }
	case CHARGE_OBJ: {
	    struct obj *otmp = getobj(recharge_type, "charge", NULL);
	    boolean b_effect;

	    if (!otmp) {
		obj->age = 0;
		return 0;
	    }
	    b_effect = obj->blessed &&
		(Role_switch == oart->role || !oart->role);
	    recharge(otmp, b_effect ? 1 : obj->cursed ? -1 : 0);
	    update_inventory();
	    break;
	  }
	case LEV_TELE:
	    level_tele();
	    break;
	case CREATE_PORTAL: {
	    int i, num_ok_dungeons, last_ok_dungeon = 0;
	    d_level newlev;
	    extern int n_dgns; /* from dungeon.c */
	    struct nh_menuitem *items;

	    /* Prevent branchporting from the Black Market shop. */
	    if (Is_blackmarket(&u.uz) && *u.ushops) {
		pline("You feel very disoriented for a moment.");
		break;
	    }

	    items = malloc(n_dgns * sizeof(struct nh_menuitem));

	    num_ok_dungeons = 0;
	    for (i = 0; i < n_dgns; i++) {
		if (!dungeons[i].dunlev_ureached)
		    continue;
		items[num_ok_dungeons].id = i+1;
		items[num_ok_dungeons].accel = 0;
		items[num_ok_dungeons].role = MI_NORMAL;
		items[num_ok_dungeons].selected = FALSE;
		strcpy(items[num_ok_dungeons].caption, dungeons[i].dname);
		num_ok_dungeons++;
		last_ok_dungeon = i;
	    }

	    if (num_ok_dungeons > 1) {
		/* more than one entry; display menu for choices */
		int n;
		int selected[1];

		n = display_menu(items, num_ok_dungeons, "Open a portal to which dungeon?", PICK_ONE, selected);
		free(items);
		if (n <= 0)
		    goto nothing_special;
		
		i = selected[0] - 1;
	    } else {
		free(items);
		i = last_ok_dungeon;	/* also first & only OK dungeon */
	    }

	    /*
	     * i is now index into dungeon structure for the new dungeon.
	     * Find the closest level in the given dungeon, open
	     * a use-once portal to that dungeon and go there.
	     * The closest level is either the entry or dunlev_ureached.
	     */
	    newlev.dnum = i;
	    if (dungeons[i].depth_start >= depth(&u.uz))
		newlev.dlevel = dungeons[i].entry_lev;
	    else
		newlev.dlevel = dungeons[i].dunlev_ureached;
	    if (u.uhave.amulet || In_endgame(&u.uz) || In_endgame(&newlev) ||
	       newlev.dnum == u.uz.dnum) {
		pline("You feel very disoriented for a moment.");
	    } else {
		if (!Blind) pline("You are surrounded by a shimmering sphere!");
		else pline("You feel weightless for a moment.");
		goto_level(&newlev, FALSE, FALSE, FALSE);
	    }
	    break;
	  }
	case ENLIGHTENING:
	    enlightenment(0);
	    break;
	case CREATE_AMMO: {
	    struct obj *otmp = mksobj(level, ARROW, TRUE, FALSE);

	    if (!otmp) goto nothing_special;
	    otmp->blessed = obj->blessed;
	    otmp->cursed = obj->cursed;
	    otmp->bknown = obj->bknown;
	    if (obj->blessed) {
		if (otmp->spe < 0) otmp->spe = 0;
		otmp->quan += rnd(10);
	    } else if (obj->cursed) {
		if (otmp->spe > 0) otmp->spe = 0;
	    } else
		otmp->quan += rnd(5);
	    otmp->owt = weight(otmp);
	    hold_another_object(otmp, "Suddenly %s out.", aobjnam(otmp, "fall"), NULL);
	    break;
	  }
	case PHASING:	/* walk through walls and stone like a xorn */
	    if (Passes_walls) goto nothing_special;
	    if (oart == &artilist[ART_IRON_BALL_OF_LIBERATION]) {
		if (Punished && obj != uball) {
		    pline("You are liberated from %s!", yname(uball));
		    unpunish(); /* remove a mundane heavy iron ball */
		}

		if (!Punished) {
		    setworn(mkobj(level, CHAIN_CLASS, TRUE), W_CHAIN);
		    setworn(obj, W_BALL);
		    uball->spe = 1;	/* attach the Iron Ball of Liberation */
		    if (!u.uswallow) {
			placebc();
			if (Blind) set_bc(1);	/* set up ball and chain variables */
			newsym(u.ux, u.uy);	/* see ball&chain if can't see self */
		    }
		    pline("Your %s chains itself to you!", xname(obj));
		}
	    }
	    if (!Hallucination)
		pline("Your body begins to feel less solid.");
	    else
		pline("You feel one with the spirit world.");
	    incr_itimeout(&Phasing, (50 + rnd(100)));
	    obj->age += Phasing; /* Time begins after phasing ends */
	    break;
	}
    } else {
	long eprop = (u.uprops[oart->inv_prop].extrinsic ^= W_ARTI),
	     iprop = u.uprops[oart->inv_prop].intrinsic;
	boolean on = (eprop & W_ARTI) != 0; /* true if invoked prop just set */

	if (on && obj->age > moves) {
	    /* the artifact is tired :-) */
	    u.uprops[oart->inv_prop].extrinsic ^= W_ARTI;
	    pline("You feel that %s %s ignoring you.",
		     the(xname(obj)), otense(obj, "are"));
	    /* can't just keep repeatedly trying */
	    obj->age += (long) dice(3,10);
	    return 1;
	} else if (!on) {
	    /* when turning off property, determine downtime */
	    /* arbitrary for now until we can tune this -dlc */
	    obj->age = moves + rnz(100);
	}

	if ((eprop & ~W_ARTI) || iprop) {
nothing_special:
	    /* you had the property from some other source too */
	    if (carried(obj))
		pline("You feel a surge of power, but nothing seems to happen.");
	    return 1;
	}
	switch(oart->inv_prop) {
	case CONFLICT:
	    if (on) pline("You feel like a rabble-rouser.");
	    else pline("You feel the tension decrease around you.");
	    break;
	case LEVITATION:
	    if (on) {
		float_up();
		spoteffects(FALSE);
	    } else float_down(I_SPECIAL|TIMEOUT, W_ARTI);
	    break;
	case INVIS:
	    if (BInvis || Blind) goto nothing_special;
	    newsym(u.ux, u.uy);
	    if (on)
		pline("Your body takes on a %s transparency...",
		     Hallucination ? "normal" : "strange");
	    else
		pline("Your body seems to unfade...");
	    break;
	}
    }

    return 1;
}